

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O0

void TypeCheck_Block(KonohaContext *kctx,KonohaStack *sfp)

{
  kNode *pkVar1;
  KonohaStack *in_RSI;
  KonohaContext *in_RDI;
  kNode *stmt;
  KClass *reqc;
  kNameSpace *ns;
  kNode *expr;
  KClass *in_stack_00000040;
  kNameSpace *in_stack_00000048;
  kNode *in_stack_00000050;
  KonohaContext *in_stack_00000058;
  
  kNode_GetNameSpace(in_RDI,in_RSI[1].field_0.asNode);
  (*(in_RDI->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"TypeCheck_Block",0x6d,"tracing..");
  pkVar1 = TypeCheckBlock(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040);
  in_RSI[-4].field_0.asNode = pkVar1;
  (*in_RDI->klib->CheckSafePoint)(in_RDI,in_RSI,0);
  return;
}

Assistant:

static KMETHOD TypeCheck_Block(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_TypeCheck2(stmt, expr, ns, reqc);
	KReturn(TypeCheckBlock(kctx, expr, ns, reqc));
}